

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

void __thiscall
duckdb::WindowBoundariesState::PartitionEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,bool is_jump,
          ValidityMask *partition_mask)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  undefined1 auVar4 [16];
  reference pvVar5;
  idx_t r;
  ulong uVar6;
  long lVar7;
  idx_t iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  idx_t n;
  idx_t local_38;
  
  pvVar5 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  auVar4 = _DAT_012b0ff0;
  pdVar1 = pvVar5->data;
  if (this->partition_count + this->order_count == 0) {
    if (count != 0) {
      iVar8 = this->input_size;
      lVar7 = count - 1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar6 = 0;
      auVar9 = auVar9 ^ _DAT_012b0ff0;
      auVar10 = _DAT_012b0fe0;
      do {
        auVar11 = auVar10 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                    auVar9._4_4_ < auVar11._4_4_) & 1)) {
          *(idx_t *)(pdVar1 + uVar6 * 8) = iVar8;
        }
        if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
            auVar11._12_4_ <= auVar9._12_4_) {
          *(idx_t *)(pdVar1 + uVar6 * 8 + 8) = iVar8;
        }
        uVar6 = uVar6 + 2;
        lVar7 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar7 + 2;
      } while ((count + 1 & 0xfffffffffffffffe) != uVar6);
    }
  }
  else {
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
    if (count != 0) {
      pdVar2 = pvVar5->data;
      puVar3 = (partition_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      do {
        if ((puVar3[row_idx + iVar8 >> 6] >> (row_idx + iVar8 & 0x3f) & 1) == 0 &&
            (is_jump & 1U) == 0) {
          r = this->partition_end;
        }
        else {
          r = this->input_size;
          this->partition_end = r;
          if (this->partition_count != 0) {
            local_38 = 1;
            r = FindNextStart(partition_mask,*(long *)(pdVar2 + iVar8 * 8) + 1,r,&local_38);
            this->partition_end = r;
          }
        }
        *(idx_t *)(pdVar1 + iVar8 * 8) = r;
        iVar8 = iVar8 + 1;
        is_jump = false;
      } while (count != iVar8);
    }
  }
  return;
}

Assistant:

void WindowBoundariesState::PartitionEnd(DataChunk &bounds, idx_t row_idx, const idx_t count, bool is_jump,
                                         const ValidityMask &partition_mask) {
	auto partition_end_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_END]);

	//	OVER()
	if (partition_count + order_count == 0) {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			partition_end_data[chunk_idx] = input_size;
		}
		return;
	}

	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
		// determine partition and peer group boundaries to ultimately figure out window size
		const auto is_same_partition = !partition_mask.RowIsValidUnsafe(row_idx);

		// when the partition changes, recompute the boundaries
		if (!is_same_partition || is_jump) {
			// find end of partition
			partition_end = input_size;
			if (partition_count) {
				const auto partition_begin = partition_begin_data[chunk_idx];
				idx_t n = 1;
				partition_end = FindNextStart(partition_mask, partition_begin + 1, input_size, n);
			}
			is_jump = false;
		}

		partition_end_data[chunk_idx] = partition_end;
	}
}